

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.cpp
# Opt level: O0

void __thiscall
zmq::socks_response_t::socks_response_t
          (socks_response_t *this,uint8_t response_code_,string *address_,uint16_t port_)

{
  undefined2 in_CX;
  string *in_RDX;
  undefined1 in_SIL;
  undefined1 *in_RDI;
  
  *in_RDI = in_SIL;
  std::__cxx11::string::string((string *)(in_RDI + 8),in_RDX);
  *(undefined2 *)(in_RDI + 0x28) = in_CX;
  return;
}

Assistant:

zmq::socks_response_t::socks_response_t (uint8_t response_code_,
                                         const std::string &address_,
                                         uint16_t port_) :
    response_code (response_code_),
    address (address_),
    port (port_)
{
}